

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O2

void PatchAlterNigelColors::fix_sword_shade_frame(ROM *rom,uint32_t address,uint8_t tile_id)

{
  initializer_list<unsigned_char> __l;
  allocator_type local_32;
  uint8_t local_31;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_31;
  local_31 = tile_id;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,__l,&local_32);
  fix_sword_shade_frame
            (rom,address,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

static void fix_sword_shade_frame(md::ROM& rom, uint32_t address, const uint8_t tile_id)
    {
        fix_sword_shade_frame(rom, address, std::vector<uint8_t>({tile_id}));
    }